

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETALAT::GetLazySuccs
          (EnvironmentNAVXYTHETALAT *this,int SourceStateID,
          vector<int,_std::allocator<int>_> *SuccIDV,vector<int,_std::allocator<int>_> *CostV,
          vector<bool,_std::allocator<bool>_> *isTrueCost,
          vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *actionV)

{
  value_type pEVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  reference ppEVar6;
  long lVar7;
  ulong uVar8;
  int in_ESI;
  long *in_RDI;
  long in_R9;
  EnvNAVXYTHETALATHashEntry_t *OutHashEntry;
  int cost;
  EnvNAVXYTHETALATHashEntry_t *OutHashEntry_1;
  int newTheta;
  int newY;
  int newX;
  EnvNAVXYTHETALATAction_t *nav3daction;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  int aind;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff58;
  code *pcVar9;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
  *in_stack_ffffffffffffff60;
  code *local_90;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  int local_34;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x175030);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x17503d);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::vector<bool,_std::allocator<bool>_>::reserve
            (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
  if (in_R9 != 0) {
    std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::clear
              ((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
               0x1750a0);
    std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::reserve
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  if (in_ESI != *(int *)((long)in_RDI + 0x134)) {
    ppEVar6 = std::
              vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ::operator[]((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                            *)(in_RDI + 0x34),(long)in_ESI);
    pEVar1 = *ppEVar6;
    for (local_34 = 0; local_34 < (int)in_RDI[0x1f]; local_34 = local_34 + 1) {
      lVar7 = *(long *)(in_RDI[0x1d] + (ulong)(uint)(int)pEVar1->Theta * 8) + (long)local_34 * 0x68;
      iVar2 = pEVar1->X + (int)*(char *)(lVar7 + 2);
      iVar3 = pEVar1->Y + (int)*(char *)(lVar7 + 3);
      uVar4 = (**(code **)(*in_RDI + 0x120))(in_RDI,(int)*(char *)(lVar7 + 4));
      uVar8 = (**(code **)(*in_RDI + 0x208))(in_RDI,iVar2,iVar3);
      if ((uVar8 & 1) != 0) {
        if (in_R9 == 0) {
          local_90 = (code *)in_RDI[0x38];
          if (((ulong)local_90 & 1) != 0) {
            local_90 = *(code **)(local_90 + *(long *)((long)in_RDI + in_RDI[0x39]) + -1);
          }
          lVar7 = (*local_90)((long *)((long)in_RDI + in_RDI[0x39]),iVar2,iVar3,uVar4);
          if (lVar7 == 0) {
            pcVar9 = (code *)in_RDI[0x3a];
            if (((ulong)pcVar9 & 1) != 0) {
              pcVar9 = *(code **)(pcVar9 + *(long *)((long)in_RDI + in_RDI[0x3b]) + -1);
            }
            (*pcVar9)((long *)((long)in_RDI + in_RDI[0x3b]),iVar2,iVar3,uVar4);
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
                     (value_type_conflict1 *)in_stack_ffffffffffffff38);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffff30,(value_type_conflict1 *)in_stack_ffffffffffffff28);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (in_stack_ffffffffffffff90,SUB81((ulong)in_RDI >> 0x38,0));
        }
        else {
          iVar5 = (**(code **)(*in_RDI + 0x1b0))
                            (in_RDI,pEVar1->X,pEVar1->Y,(int)pEVar1->Theta,lVar7);
          if (iVar5 < 1000000000) {
            in_stack_ffffffffffffff40 = (vector<bool,_std::allocator<bool>_> *)in_RDI[0x38];
            if (((ulong)in_stack_ffffffffffffff40 & 1) != 0) {
              in_stack_ffffffffffffff40 =
                   *(vector<bool,_std::allocator<bool>_> **)
                    ((long)in_stack_ffffffffffffff40 + *(long *)((long)in_RDI + in_RDI[0x39]) + -1);
            }
            in_stack_ffffffffffffff90 =
                 (vector<bool,_std::allocator<bool>_> *)
                 (*(code *)in_stack_ffffffffffffff40)
                           ((long *)((long)in_RDI + in_RDI[0x39]),iVar2,iVar3,uVar4);
            if (in_stack_ffffffffffffff90 == (vector<bool,_std::allocator<bool>_> *)0x0) {
              in_stack_ffffffffffffff30 = (vector<int,_std::allocator<int>_> *)in_RDI[0x3a];
              in_stack_ffffffffffffff38 = (value_type *)((long)in_RDI + in_RDI[0x3b]);
              in_stack_ffffffffffffff28 = in_stack_ffffffffffffff30;
              if (((ulong)in_stack_ffffffffffffff30 & 1) != 0) {
                in_stack_ffffffffffffff28 =
                     *(vector<int,_std::allocator<int>_> **)
                      ((undefined1 *)
                       ((long)&in_stack_ffffffffffffff30[-1].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7) +
                      (long)*in_stack_ffffffffffffff38);
              }
              in_stack_ffffffffffffff90 =
                   (vector<bool,_std::allocator<bool>_> *)
                   (*(code *)in_stack_ffffffffffffff28)(in_stack_ffffffffffffff38,iVar2,iVar3,uVar4)
              ;
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
                       (value_type_conflict1 *)in_stack_ffffffffffffff38);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
                       (value_type_conflict1 *)in_stack_ffffffffffffff38);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      (in_stack_ffffffffffffff90,SUB81((ulong)in_RDI >> 0x38,0));
            if (in_R9 != 0) {
              std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::
              push_back((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                         *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetLazySuccs(
    int SourceStateID,
    std::vector<int>* SuccIDV,
    std::vector<int>* CostV,
    std::vector<bool>* isTrueCost,
    std::vector<EnvNAVXYTHETALATAction_t*>* actionV)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    // clear the successor array
    SuccIDV->clear();
    CostV->clear();
    SuccIDV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    CostV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    isTrueCost->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    if (actionV != NULL) {
        actionV->clear();
        actionV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    }

    // goal state should be absorbing
    if (SourceStateID == EnvNAVXYTHETALAT.goalstateid) {
        return;
    }

    // get X, Y for the state
    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[SourceStateID];

    // iterate through actions
    for (aind = 0; aind < EnvNAVXYTHETALATCfg.actionwidth; aind++) {
        EnvNAVXYTHETALATAction_t* nav3daction = &EnvNAVXYTHETALATCfg.ActionsV[(unsigned int)HashEntry->Theta][aind];
        int newX = HashEntry->X + nav3daction->dX;
        int newY = HashEntry->Y + nav3daction->dY;
        int newTheta = normalizeDiscAngle(nav3daction->endtheta);

        // skip the invalid cells
        if (!IsValidCell(newX, newY)) {
            continue;
        }

        // if we are supposed to return the action, then don't do lazy
        if (!actionV) {
            EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
            if ((OutHashEntry = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
                OutHashEntry = (this->*CreateNewHashEntry)(newX, newY, newTheta);
            }
            SuccIDV->push_back(OutHashEntry->stateID);
            CostV->push_back(nav3daction->cost);
            isTrueCost->push_back(false);
            continue;
        }

        // get cost
        int cost = GetActionCost(HashEntry->X, HashEntry->Y, HashEntry->Theta, nav3daction);
        if (cost >= INFINITECOST) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
        if ((OutHashEntry = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
            // have to create a new entry
            OutHashEntry = (this->*CreateNewHashEntry)(newX, newY, newTheta);
        }

        SuccIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(cost);
        isTrueCost->push_back(true);
        if (actionV != NULL) {
            actionV->push_back(nav3daction);
        }
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}